

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::NonMaximumSuppression::_InternalSerialize
          (NonMaximumSuppression *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  long lVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  undefined8 *puVar4;
  ulong uVar5;
  
  if (this->_oneof_case_[0] == 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::NonMaximumSuppression_PickTop>
                       (1,(this->SuppressionMethod_).picktop_,puVar3,stream);
  }
  uVar2 = this->_oneof_case_[1];
  if (uVar2 == 100) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::StringVector>
                       (100,(this->ClassLabels_).stringclasslabels_,puVar3,stream);
    uVar2 = this->_oneof_case_[1];
  }
  if (uVar2 == 0x65) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::Int64Vector>
                       (0x65,(this->ClassLabels_).int64classlabels_,puVar3,stream);
  }
  if (this->iouthreshold_ != 0.0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteDoubleToArray
                       (0x6e,this->iouthreshold_,puVar3);
  }
  if (this->confidencethreshold_ != 0.0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteDoubleToArray
                       (0x6f,this->confidencethreshold_,puVar3);
  }
  puVar4 = (undefined8 *)
           ((ulong)(this->confidenceinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar1 = puVar4[1];
  if (lVar1 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar4,(int)lVar1,SERIALIZE,
               "CoreML.Specification.NonMaximumSuppression.confidenceInputFeatureName");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,200,
                        (string *)
                        ((ulong)(this->confidenceinputfeaturename_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe),target);
  }
  puVar4 = (undefined8 *)
           ((ulong)(this->coordinatesinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar1 = puVar4[1];
  if (lVar1 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar4,(int)lVar1,SERIALIZE,
               "CoreML.Specification.NonMaximumSuppression.coordinatesInputFeatureName");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0xc9,
                        (string *)
                        ((ulong)(this->coordinatesinputfeaturename_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe),target);
  }
  puVar4 = (undefined8 *)
           ((ulong)(this->iouthresholdinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar1 = puVar4[1];
  if (lVar1 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar4,(int)lVar1,SERIALIZE,
               "CoreML.Specification.NonMaximumSuppression.iouThresholdInputFeatureName");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0xca,
                        (string *)
                        ((ulong)(this->iouthresholdinputfeaturename_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe),target);
  }
  puVar4 = (undefined8 *)
           ((ulong)(this->confidencethresholdinputfeaturename_).tagged_ptr_.ptr_ &
           0xfffffffffffffffe);
  lVar1 = puVar4[1];
  if (lVar1 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar4,(int)lVar1,SERIALIZE,
               "CoreML.Specification.NonMaximumSuppression.confidenceThresholdInputFeatureName");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0xcb,
                        (string *)
                        ((ulong)(this->confidencethresholdinputfeaturename_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe),target);
  }
  puVar4 = (undefined8 *)
           ((ulong)(this->confidenceoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar1 = puVar4[1];
  if (lVar1 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar4,(int)lVar1,SERIALIZE,
               "CoreML.Specification.NonMaximumSuppression.confidenceOutputFeatureName");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0xd2,
                        (string *)
                        ((ulong)(this->confidenceoutputfeaturename_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe),target);
  }
  puVar4 = (undefined8 *)
           ((ulong)(this->coordinatesoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar1 = puVar4[1];
  if (lVar1 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar4,(int)lVar1,SERIALIZE,
               "CoreML.Specification.NonMaximumSuppression.coordinatesOutputFeatureName");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0xd3,
                        (string *)
                        ((ulong)(this->coordinatesoutputfeaturename_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe),target);
  }
  uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) == 0) {
    return target;
  }
  uVar5 = uVar5 & 0xfffffffffffffffc;
  puVar3 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar5 + 8),*(int *)(uVar5 + 0x10),target);
  return puVar3;
}

Assistant:

uint8_t* NonMaximumSuppression::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.NonMaximumSuppression)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.NonMaximumSuppression.PickTop pickTop = 1;
  if (_internal_has_picktop()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        1, _Internal::picktop(this), target, stream);
  }

  // .CoreML.Specification.StringVector stringClassLabels = 100;
  if (_internal_has_stringclasslabels()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        100, _Internal::stringclasslabels(this), target, stream);
  }

  // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
  if (_internal_has_int64classlabels()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        101, _Internal::int64classlabels(this), target, stream);
  }

  // double iouThreshold = 110;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_iouthreshold = this->_internal_iouthreshold();
  uint64_t raw_iouthreshold;
  memcpy(&raw_iouthreshold, &tmp_iouthreshold, sizeof(tmp_iouthreshold));
  if (raw_iouthreshold != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(110, this->_internal_iouthreshold(), target);
  }

  // double confidenceThreshold = 111;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_confidencethreshold = this->_internal_confidencethreshold();
  uint64_t raw_confidencethreshold;
  memcpy(&raw_confidencethreshold, &tmp_confidencethreshold, sizeof(tmp_confidencethreshold));
  if (raw_confidencethreshold != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(111, this->_internal_confidencethreshold(), target);
  }

  // string confidenceInputFeatureName = 200;
  if (!this->_internal_confidenceinputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_confidenceinputfeaturename().data(), static_cast<int>(this->_internal_confidenceinputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NonMaximumSuppression.confidenceInputFeatureName");
    target = stream->WriteStringMaybeAliased(
        200, this->_internal_confidenceinputfeaturename(), target);
  }

  // string coordinatesInputFeatureName = 201;
  if (!this->_internal_coordinatesinputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_coordinatesinputfeaturename().data(), static_cast<int>(this->_internal_coordinatesinputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NonMaximumSuppression.coordinatesInputFeatureName");
    target = stream->WriteStringMaybeAliased(
        201, this->_internal_coordinatesinputfeaturename(), target);
  }

  // string iouThresholdInputFeatureName = 202;
  if (!this->_internal_iouthresholdinputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_iouthresholdinputfeaturename().data(), static_cast<int>(this->_internal_iouthresholdinputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NonMaximumSuppression.iouThresholdInputFeatureName");
    target = stream->WriteStringMaybeAliased(
        202, this->_internal_iouthresholdinputfeaturename(), target);
  }

  // string confidenceThresholdInputFeatureName = 203;
  if (!this->_internal_confidencethresholdinputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_confidencethresholdinputfeaturename().data(), static_cast<int>(this->_internal_confidencethresholdinputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NonMaximumSuppression.confidenceThresholdInputFeatureName");
    target = stream->WriteStringMaybeAliased(
        203, this->_internal_confidencethresholdinputfeaturename(), target);
  }

  // string confidenceOutputFeatureName = 210;
  if (!this->_internal_confidenceoutputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_confidenceoutputfeaturename().data(), static_cast<int>(this->_internal_confidenceoutputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NonMaximumSuppression.confidenceOutputFeatureName");
    target = stream->WriteStringMaybeAliased(
        210, this->_internal_confidenceoutputfeaturename(), target);
  }

  // string coordinatesOutputFeatureName = 211;
  if (!this->_internal_coordinatesoutputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_coordinatesoutputfeaturename().data(), static_cast<int>(this->_internal_coordinatesoutputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NonMaximumSuppression.coordinatesOutputFeatureName");
    target = stream->WriteStringMaybeAliased(
        211, this->_internal_coordinatesoutputfeaturename(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.NonMaximumSuppression)
  return target;
}